

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O3

RK_S32 compare_pic_by_lt_pic_num_asc(void *arg1,void *arg2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)(*arg2 + 0x1c) <= *(int *)(*arg1 + 0x1c)) {
    uVar1 = (uint)(*(int *)(*arg2 + 0x1c) < *(int *)(*arg1 + 0x1c));
  }
  return uVar1;
}

Assistant:

static RK_S32 compare_pic_by_lt_pic_num_asc(const void *arg1, const void *arg2)
{
    RK_S32 long_term_pic_num1 = (*(H264_StorePic_t**)arg1)->long_term_pic_num;
    RK_S32 long_term_pic_num2 = (*(H264_StorePic_t**)arg2)->long_term_pic_num;

    if (long_term_pic_num1 < long_term_pic_num2)
        return -1;
    if (long_term_pic_num1 > long_term_pic_num2)
        return 1;
    else
        return 0;
}